

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QList<int> * __thiscall
QDockAreaLayout::gapIndex
          (QList<int> *__return_storage_ptr__,QDockAreaLayout *this,QPoint *pos,bool disallowTabs)

{
  bool bVar1;
  char cVar2;
  DockOptions DVar3;
  undefined7 in_register_00000009;
  long lVar4;
  long lVar5;
  int i;
  DockPosition dockPos;
  QDockAreaLayoutInfo *this_00;
  ulong uVar6;
  long in_FS_OFFSET;
  bool local_8c;
  TabMode local_88;
  QList<int> local_78;
  undefined1 local_58 [28];
  DockPosition local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  DVar3 = QMainWindow::dockOptions(this->mainWindow);
  if ((int)CONCAT71(in_register_00000009,disallowTabs) == 0) {
    local_88 = ForceTabs;
    if (((uint)DVar3.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
               super_QFlagsStorage<QMainWindow::DockOption>.i & 8) == 0) {
      local_88 = (TabMode)(((uint)DVar3.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                                  super_QFlagsStorage<QMainWindow::DockOption>.i & 0x14) != 0);
    }
    local_8c = ((uint)DVar3.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                      super_QFlagsStorage<QMainWindow::DockOption>.i & 10) == 2;
  }
  else {
    local_8c = SUB41(((uint)DVar3.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                            super_QFlagsStorage<QMainWindow::DockOption>.i & 2) >> 1,0);
    local_88 = NoTabs;
  }
  lVar4 = 0;
  while( true ) {
    this_00 = this->docks + lVar4;
    uVar6 = 0xffffffffffffffff;
    lVar5 = 0;
    do {
      uVar6 = uVar6 + 1;
      if ((ulong)(this_00->item_list).d.size <= uVar6) goto LAB_003fcef7;
      bVar1 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&((this_00->item_list).d.ptr)->widgetItem + lVar5));
      lVar5 = lVar5 + 0x28;
    } while (bVar1);
    cVar2 = QRect::contains((QPoint *)&this_00->rect,SUB81(pos,0));
    if (cVar2 != '\0') break;
LAB_003fcef7:
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      lVar4 = 0;
      do {
        uVar6 = 0xffffffffffffffff;
        lVar5 = 0;
        do {
          uVar6 = uVar6 + 1;
          if ((ulong)this->docks[lVar4].item_list.d.size <= uVar6) {
            local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            dockPos = (DockPosition)lVar4;
            local_58._0_16_ = (undefined1  [16])gapRect(this,dockPos);
            cVar2 = QRect::contains((QPoint *)local_58,SUB81(pos,0));
            if (cVar2 != '\0') {
              local_3c = dockPos;
              if ((((uint)DVar3.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                          super_QFlagsStorage<QMainWindow::DockOption>.i & 8) == 0) ||
                 (this->docks[lVar4].item_list.d.size == 0)) {
                local_78.d.d = (Data *)0x0;
                local_78.d.ptr = (int *)0x0;
                local_78.d.size = 0;
              }
              else {
                local_78.d.d = (Data *)0x0;
                local_78.d.ptr = (int *)0x0;
                local_78.d.size = 0;
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_78,0,(int *)&local_3c);
                QList<int>::end(&local_78);
                local_3c = ~LeftDock;
              }
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)&local_3c);
              QList<int>::end(&local_78);
              local_3c = LeftDock;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)&local_3c);
              QList<int>::end(&local_78);
              (__return_storage_ptr__->d).d = local_78.d.d;
              (__return_storage_ptr__->d).ptr = local_78.d.ptr;
              (__return_storage_ptr__->d).size = local_78.d.size;
              if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + 1;
                UNLOCK();
                LOCK();
                ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
                }
              }
              if (cVar2 != '\0') goto LAB_003fd0d7;
            }
            break;
          }
          bVar1 = QDockAreaLayoutItem::skip
                            ((QDockAreaLayoutItem *)
                             ((long)&(this->docks[lVar4].item_list.d.ptr)->widgetItem + lVar5));
          lVar5 = lVar5 + 0x28;
        } while (bVar1);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (int *)0x0;
      (__return_storage_ptr__->d).size = 0;
LAB_003fd0d7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QDockAreaLayoutInfo::gapIndex(__return_storage_ptr__,this_00,pos,local_8c,local_88);
  if ((__return_storage_ptr__->d).size != 0) {
    local_78.d.d = (Data *)CONCAT44(local_78.d.d._4_4_,(int)lVar4);
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,0,(int *)&local_78);
  }
  goto LAB_003fd0d7;
}

Assistant:

QList<int> QDockAreaLayout::gapIndex(const QPoint &pos, bool disallowTabs) const
{
    QMainWindow::DockOptions opts = mainWindow->dockOptions();
    bool nestingEnabled = opts & QMainWindow::AllowNestedDocks;
    QDockAreaLayoutInfo::TabMode tabMode = QDockAreaLayoutInfo::NoTabs;
#if QT_CONFIG(tabbar)
    if (!disallowTabs) {
        if (opts & QMainWindow::AllowTabbedDocks || opts & QMainWindow::VerticalTabs)
            tabMode = QDockAreaLayoutInfo::AllowTabs;
        if (opts & QMainWindow::ForceTabbedDocks)
            tabMode = QDockAreaLayoutInfo::ForceTabs;

        if (tabMode == QDockAreaLayoutInfo::ForceTabs)
            nestingEnabled = false;
    }
#endif


    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &info = docks[i];

        if (!info.isEmpty() && info.rect.contains(pos)) {
            QList<int> result
                = docks[i].gapIndex(pos, nestingEnabled, tabMode);
            if (!result.isEmpty())
                result.prepend(i);
            return result;
        }
    }

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &info = docks[i];

        if (info.isEmpty()) {
            const QRect r = gapRect(static_cast<QInternal::DockPosition>(i));
            if (r.contains(pos)) {
                if (opts & QMainWindow::ForceTabbedDocks && !info.item_list.isEmpty()) {
                    //in case of ForceTabbedDocks, we pass -1 in order to force the gap to be tabbed
                    //it mustn't be completely empty otherwise it won't work
                    return QList<int>() << i << -1 << 0;
                } else {
                    return QList<int>() << i << 0;
                }
            }
        }
    }

    return QList<int>();
}